

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_encoder.hpp
# Opt level: O2

void __thiscall
jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
put_length(basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
          size_t length)

{
  ser_error *this_00;
  error_category *peVar1;
  error_code ec;
  
  if (length < 0x100) {
    binary_stream_sink::push_back(&this->sink_,'U');
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              ((uchar)length,(back_insert_iterator<jsoncons::binary_stream_sink>)&this->sink_);
    return;
  }
  if (length < 0x8000) {
    binary_stream_sink::push_back(&this->sink_,'I');
    binary::
    native_to_big<unsigned_short,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              ((unsigned_short)length,
               (back_insert_iterator<jsoncons::binary_stream_sink>)&this->sink_);
    return;
  }
  if (length < 0x80000000) {
    binary_stream_sink::push_back(&this->sink_,'l');
    binary::
    native_to_big<unsigned_int,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              ((uint)length,(back_insert_iterator<jsoncons::binary_stream_sink>)&this->sink_);
    return;
  }
  if (-1 < (long)length) {
    binary_stream_sink::push_back(&this->sink_,'L');
    binary::
    native_to_big<unsigned_long,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              (length,(back_insert_iterator<jsoncons::binary_stream_sink>)&this->sink_);
    return;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  peVar1 = ubjson_error_category();
  ec._M_cat = peVar1;
  ec._0_8_ = 8;
  ser_error::ser_error(this_00,ec);
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void put_length(std::size_t length)
    {
        if (length <= (std::numeric_limits<uint8_t>::max)())
        {
            sink_.push_back(ubjson_type::uint8_type);
            binary::native_to_big(static_cast<uint8_t>(length), std::back_inserter(sink_));
        }
        else if (length <= (std::size_t)(std::numeric_limits<int16_t>::max)())
        {
            sink_.push_back(ubjson_type::int16_type);
            binary::native_to_big(static_cast<uint16_t>(length), std::back_inserter(sink_));
        }
        else if (length <= (std::size_t)(std::numeric_limits<int32_t>::max)())
        {
            sink_.push_back(ubjson_type::int32_type);
            binary::native_to_big(static_cast<uint32_t>(length),std::back_inserter(sink_));
        }
        else if (length <= (std::size_t)(std::numeric_limits<int64_t>::max)())
        {
            sink_.push_back(ubjson_type::int64_type);
            binary::native_to_big(static_cast<uint64_t>(length),std::back_inserter(sink_));
        }
        else
        {
            JSONCONS_THROW(ser_error(ubjson_errc::too_many_items));
        }
    }